

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t::event_queue_impl_t
          (event_queue_impl_t *this,main_thread_sync_objects_t *sync_objects)

{
  event_queue_t::event_queue_t(&this->super_event_queue_t);
  (this->super_event_queue_t)._vptr_event_queue_t = (_func_int **)&PTR__event_queue_impl_t_002c8a60;
  this->m_sync_objects = sync_objects;
  std::_Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::_Deque_base
            (&(this->m_demands).
              super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
            );
  return;
}

Assistant:

event_queue_impl_t( main_thread_sync_objects_t & sync_objects )
			:	m_sync_objects( sync_objects )
			{}